

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall
QWidgetPrivate::updateBrushOrigin(QWidgetPrivate *this,QPainter *painter,QBrush *brush)

{
  long lVar1;
  BrushStyle BVar2;
  QWidget *pQVar3;
  QAbstractScrollArea *pQVar4;
  QWidget *pQVar5;
  QObjectData *pQVar6;
  QPainter *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractScrollAreaPrivate *priv;
  QObjectData *scrollPrivate;
  QAbstractScrollArea *scrollArea;
  QWidget *q;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  BVar2 = QBrush::style((QBrush *)0x3669f3);
  if (BVar2 != NoBrush) {
    BVar2 = QBrush::style((QBrush *)0x366a02);
    if (BVar2 != SolidPattern) {
      pQVar4 = qobject_cast<QAbstractScrollArea*>((QObject *)0x366a1f);
      if (pQVar4 != (QAbstractScrollArea *)0x0) {
        pQVar5 = QAbstractScrollArea::viewport
                           ((QAbstractScrollArea *)
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        if (pQVar5 == pQVar3) {
          pQVar6 = QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_>::data
                             ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)
                              &(pQVar4->super_QFrame).super_QWidget.field_0x8);
          (**(code **)(*(long *)pQVar6 + 0xb8))();
          ::operator-((QPoint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
          QPainter::setBrushOrigin
                    (in_RSI,(QPoint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
          ;
        }
      }
      local_19 = true;
      goto LAB_00366a9a;
    }
  }
  local_19 = false;
LAB_00366a9a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::updateBrushOrigin(QPainter *painter, const QBrush &brush) const
{
#if QT_CONFIG(scrollarea)
    Q_Q(const QWidget);
    //If we are painting the viewport of a scrollarea, we must apply an offset to the brush in case we are drawing a texture
    if (brush.style() == Qt::NoBrush || brush.style() == Qt::SolidPattern)
        return false;
    QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(parent);
    if (scrollArea && scrollArea->viewport() == q) {
        QObjectData *scrollPrivate = static_cast<QWidget *>(scrollArea)->d_ptr.data();
        QAbstractScrollAreaPrivate *priv = static_cast<QAbstractScrollAreaPrivate *>(scrollPrivate);
        painter->setBrushOrigin(-priv->contentsOffset());
    }
#endif // QT_CONFIG(scrollarea)
    return true;
}